

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O2

ze_result_t __thiscall
loader::zesDriverGetDeviceByUuidExp
          (loader *this,zes_driver_handle_t hDriver,zes_uuid_t uuid,zes_device_handle_t *phDevice,
          ze_bool_t *onSubdevice,uint32_t *subdeviceId)

{
  zes_pfnDriverGetDeviceByUuidExp_t p_Var1;
  ze_result_t zVar2;
  object_t<_ze_device_handle_t_*> *poVar3;
  zes_device_handle_t *_params;
  zes_uuid_t zVar4;
  dditable_t *dditable;
  dditable_t *local_10;
  
  _params = uuid.id._8_8_;
  zVar4.id._8_8_ = uuid.id._0_8_;
  local_10 = *(dditable_t **)(this + 8);
  p_Var1 = (local_10->zes).DriverExp.pfnGetDeviceByUuidExp;
  if (p_Var1 == (zes_pfnDriverGetDeviceByUuidExp_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar4.id._0_8_ = hDriver;
    zVar2 = (*p_Var1)(*(zes_driver_handle_t *)this,zVar4,_params,(ze_bool_t *)phDevice,
                      (uint32_t *)onSubdevice);
    if (zVar2 == ZE_RESULT_SUCCESS) {
      poVar3 = singleton_factory_t<object_t<_ze_device_handle_t*>,_ze_device_handle_t*>::
               getInstance<_ze_device_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_device_handle_t*>,_ze_device_handle_t*>
                           *)(context + 0x7e0),_params,&local_10);
      *_params = (zes_device_handle_t)poVar3;
      zVar2 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGetDeviceByUuidExp(
        zes_driver_handle_t hDriver,                    ///< [in] handle of the sysman driver instance
        zes_uuid_t uuid,                                ///< [in] universal unique identifier.
        zes_device_handle_t* phDevice,                  ///< [out] Sysman handle of the device.
        ze_bool_t* onSubdevice,                         ///< [out] True if the UUID belongs to the sub-device; false means that
                                                        ///< UUID belongs to the root device.
        uint32_t* subdeviceId                           ///< [out] If onSubdevice is true, this gives the ID of the sub-device
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_driver_object_t*>( hDriver )->dditable;
        auto pfnGetDeviceByUuidExp = dditable->zes.DriverExp.pfnGetDeviceByUuidExp;
        if( nullptr == pfnGetDeviceByUuidExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDriver = reinterpret_cast<zes_driver_object_t*>( hDriver )->handle;

        // forward to device-driver
        result = pfnGetDeviceByUuidExp( hDriver, uuid, phDevice, onSubdevice, subdeviceId );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phDevice = reinterpret_cast<zes_device_handle_t>(
                context->zes_device_factory.getInstance( *phDevice, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }